

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

LRUHandle ** __thiscall
leveldb::anon_unknown_0::HandleTable::FindPointer(HandleTable *this,Slice *key,uint32_t hash)

{
  bool bVar1;
  LRUHandle *this_00;
  LRUHandle **ppLVar2;
  long in_FS_OFFSET;
  Slice local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  ppLVar2 = this->list_ + (this->length_ - 1 & hash);
  while (this_00 = *ppLVar2, this_00 != (LRUHandle *)0x0) {
    if (this_00->hash == hash) {
      local_38 = LRUHandle::key(this_00);
      bVar1 = leveldb::operator!=(key,&local_38);
      if (!bVar1) break;
      this_00 = *ppLVar2;
    }
    ppLVar2 = &this_00->next_hash;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return ppLVar2;
  }
  __stack_chk_fail();
}

Assistant:

LRUHandle** FindPointer(const Slice& key, uint32_t hash) {
    LRUHandle** ptr = &list_[hash & (length_ - 1)];
    while (*ptr != nullptr && ((*ptr)->hash != hash || key != (*ptr)->key())) {
      ptr = &(*ptr)->next_hash;
    }
    return ptr;
  }